

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.h
# Opt level: O3

void __thiscall
flatbuffers::BaseGenerator::BaseGenerator
          (BaseGenerator *this,Parser *parser,string *path,string *file_name,
          string *qualifying_start,string *qualifying_separator,string *default_extension)

{
  pointer pcVar1;
  
  this->_vptr_BaseGenerator = (_func_int **)&PTR___cxa_pure_virtual_003e8738;
  this->parser_ = parser;
  this->path_ = path;
  this->file_name_ = file_name;
  (this->qualifying_start_)._M_dataplus._M_p = (pointer)&(this->qualifying_start_).field_2;
  pcVar1 = (qualifying_start->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->qualifying_start_,pcVar1,pcVar1 + qualifying_start->_M_string_length);
  (this->qualifying_separator_)._M_dataplus._M_p = (pointer)&(this->qualifying_separator_).field_2;
  pcVar1 = (qualifying_separator->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->qualifying_separator_,pcVar1,
             pcVar1 + qualifying_separator->_M_string_length);
  (this->default_extension_)._M_dataplus._M_p = (pointer)&(this->default_extension_).field_2;
  pcVar1 = (default_extension->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->default_extension_,pcVar1,pcVar1 + default_extension->_M_string_length
            );
  return;
}

Assistant:

BaseGenerator(const Parser &parser, const std::string &path,
                const std::string &file_name, std::string qualifying_start,
                std::string qualifying_separator, std::string default_extension)
      : parser_(parser),
        path_(path),
        file_name_(file_name),
        qualifying_start_(qualifying_start),
        qualifying_separator_(qualifying_separator),
        default_extension_(default_extension) {}